

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

Var Js::TaggedInt::Modulus(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  uint uVar9;
  uint uVar10;
  
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      pcVar5 = "(Is(aValue))";
      pcVar4 = "Ensure var is actually a \'TaggedInt\'";
      uVar9 = 0x43;
      goto LAB_00b0b2b5;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    pcVar5 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar4 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar9 = 0x2a;
LAB_00b0b2b5:
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar9,pcVar5,pcVar4);
    if (!bVar2) goto LAB_00b0b418;
    *puVar3 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      pcVar5 = "(Is(aValue))";
      pcVar4 = "Ensure var is actually a \'TaggedInt\'";
      uVar9 = 0x43;
      goto LAB_00b0b379;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    pcVar5 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar4 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar9 = 0x2a;
LAB_00b0b379:
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar9,pcVar5,pcVar4);
    if (!bVar2) {
LAB_00b0b418:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar6 = (uint)aLeft;
  uVar10 = (uint)aRight;
  if (((0 < (int)uVar6) && (0 < (int)uVar10)) && ((uVar10 + 0x7fffffff & uVar10) == 0)) {
    uVar7 = (ulong)(uVar6 & uVar10 - 1 & 0x7fffffff);
LAB_00b0b3d8:
    return (Var)(uVar7 | 0x1000000000000);
  }
  if (uVar10 == 0) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).nan.ptr;
  }
  if (uVar6 == 0) {
LAB_00b0b3f2:
    puVar8 = &DAT_1000000000000;
  }
  else {
    if (uVar10 != 0xffffffff || uVar6 != 0x80000000) {
      uVar7 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | (ulong)aLeft & 0xffffffff) %
              (long)(int)uVar10;
      if ((int)uVar7 != 0) {
        uVar7 = uVar7 & 0xffffffff;
        goto LAB_00b0b3d8;
      }
      if (-1 < (int)uVar6) goto LAB_00b0b3f2;
    }
    puVar8 = (undefined1 *)
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).negativeZero.ptr;
  }
  return puVar8;
}

Assistant:

Var TaggedInt::Modulus(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        int nLeft    = ToInt32(aLeft);
        int nRight   = ToInt32(aRight);

        // nLeft is positive and nRight is +2^i
        // Fast path for Power of 2 divisor
        if (nLeft > 0 && ::Math::IsPow2(nRight))
        {
            return ToVarUnchecked(nLeft & (nRight - 1));
        }

        if (nRight == 0)
        {
            return scriptContext->GetLibrary()->GetNaN();
        }

        if (nLeft == 0)
        {
          return ToVarUnchecked(0);
        }
        int result;
#if INT32VAR
        // 0x80000000 / -1 (or %) will trigger an integer overflow exception
        if (nLeft != INT_MIN || nRight != -1)
        {
#endif
            result = nLeft % nRight;

#if INT32VAR
        }
        else
        {
            int64 left64 = nLeft;
            int64 right64 = nRight;
            result = (int)(left64 % right64);
        }
#endif
        if (result != 0)
        {
            return ToVarUnchecked(result);
        }
        else
        {
            //
            // return -0 if left is negative
            //

            if (nLeft >= 0)
            {
                return ToVarUnchecked(0);
            }
            else
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
        }
    }